

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RunPool.h
# Opt level: O1

void __thiscall RunPool<int>::Add(RunPool<int> *this,int *value)

{
  int *piVar1;
  RunBlock<int> *pRVar2;
  RunBlock<int> *pRVar3;
  
  pRVar3 = next_free_;
  pRVar2 = this->end_back_;
  if ((ulong)(uint)pRVar2->next_free_pos_ < 800) {
    pRVar2->values[(uint)pRVar2->next_free_pos_] = *value;
  }
  else {
    piVar1 = next_free_->values;
    next_free_ = next_free_ + 1;
    *piVar1 = *value;
    pRVar3->prev = pRVar2;
    pRVar2->next = pRVar3;
    this->end_back_ = pRVar3;
    this->end_block_ = pRVar3;
    this->size_ = this->size_ + 800;
  }
  piVar1 = &this->end_back_->next_free_pos_;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void Add(ValueType &value) {
        if(end_back_->next_free_pos_ < kValuesPerBlock) {
            end_back_->values[end_back_->next_free_pos_] = value;
        } else {
            RunBlock<ValueType>* temp = Alloc();
            temp->values[0] = value;
            temp->prev = end_back_;
            end_back_->next = temp;
            end_back_ = temp;
            end_block_ = temp;
            size_ += kValuesPerBlock;
        }
        end_back_->next_free_pos_++;
    }